

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O1

void __thiscall Assimp::LWO::Surface::Surface(Surface *this,Surface *param_1)

{
  pointer pcVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined3 uVar9;
  bool bVar10;
  
  (this->mName)._M_dataplus._M_p = (pointer)&(this->mName).field_2;
  pcVar1 = (param_1->mName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->mName)._M_string_length);
  (this->mColor).r = (param_1->mColor).r;
  (this->mColor).g = (param_1->mColor).g;
  (this->mColor).b = (param_1->mColor).b;
  uVar9 = *(undefined3 *)&param_1->field_0x2d;
  fVar2 = param_1->mDiffuseValue;
  fVar3 = param_1->mSpecularValue;
  fVar4 = param_1->mTransparency;
  fVar5 = param_1->mGlossiness;
  fVar6 = param_1->mLuminosity;
  fVar7 = param_1->mColorHighlights;
  fVar8 = param_1->mMaximumSmoothAngle;
  this->bDoubleSided = param_1->bDoubleSided;
  *(undefined3 *)&this->field_0x2d = uVar9;
  this->mDiffuseValue = fVar2;
  this->mSpecularValue = fVar3;
  this->mTransparency = fVar4;
  this->mGlossiness = fVar5;
  this->mLuminosity = fVar6;
  this->mColorHighlights = fVar7;
  this->mMaximumSmoothAngle = fVar8;
  (this->mVCMap)._M_dataplus._M_p = (pointer)&(this->mVCMap).field_2;
  pcVar1 = (param_1->mVCMap)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mVCMap,pcVar1,pcVar1 + (param_1->mVCMap)._M_string_length);
  this->mVCMapType = param_1->mVCMapType;
  std::__cxx11::list<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>::list
            (&this->mShaders,&param_1->mShaders);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mColorTextures,&param_1->mColorTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mDiffuseTextures,&param_1->mDiffuseTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mSpecularTextures,&param_1->mSpecularTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mOpacityTextures,&param_1->mOpacityTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mBumpTextures,&param_1->mBumpTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mGlossinessTextures,&param_1->mGlossinessTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mReflectionTextures,&param_1->mReflectionTextures);
  fVar2 = param_1->mBumpIntensity;
  bVar10 = param_1->mWireframe;
  uVar9 = *(undefined3 *)&param_1->field_0x141;
  fVar3 = param_1->mAdditiveTransparency;
  this->mIOR = param_1->mIOR;
  this->mBumpIntensity = fVar2;
  this->mWireframe = bVar10;
  *(undefined3 *)&this->field_0x141 = uVar9;
  this->mAdditiveTransparency = fVar3;
  return;
}

Assistant:

Surface()
        : mColor                (0.78431f,0.78431f,0.78431f)
        , bDoubleSided          (false)
        , mDiffuseValue         (1.f)
        , mSpecularValue        (0.f)
        , mTransparency         (0.f)
        , mGlossiness           (0.4f)
        , mLuminosity           (0.f)
        , mColorHighlights      (0.f)
        , mMaximumSmoothAngle   (0.f) // 0 == not specified, no smoothing
        , mVCMap                ("")
        , mVCMapType            (AI_LWO_RGBA)
        , mIOR                  (1.f) // vakuum
        , mBumpIntensity        (1.f)
        , mWireframe            (false)
        , mAdditiveTransparency (0.f)
    {}